

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_image.cpp
# Opt level: O0

void __thiscall Am_Image_Array_Data::Am_Image_Array_Data(Am_Image_Array_Data *this,char *file_name)

{
  size_t sVar1;
  char *pcVar2;
  char *file_name_local;
  Am_Image_Array_Data *this_local;
  
  Am_Wrapper::Am_Wrapper(&this->super_Am_Wrapper);
  (this->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)&PTR_ID_00411480;
  this->x_hot = -1;
  this->y_hot = -1;
  this->main_bitmap = 0;
  this->main_mask = 0;
  this->main_inverted_mask = 0;
  this->colors = (XColor *)0x0;
  this->num_colors = 0;
  this->image_ = (Am_Generic_Image *)0x0;
  sVar1 = strlen(file_name);
  pcVar2 = (char *)operator_new__(sVar1 + 1);
  this->name = pcVar2;
  strcpy(this->name,file_name);
  this->main_display = (Display *)0x0;
  this->head = (Bitmap_Item *)0x0;
  this->next = list;
  list = this;
  return;
}

Assistant:

Am_Image_Array_Data::Am_Image_Array_Data(const char *file_name)
{
  x_hot = -1;
  y_hot = -1;
  main_bitmap = 0;
  main_mask = 0;
  main_inverted_mask = 0;
  colors = nullptr;
  num_colors = 0;
  image_ = nullptr;
  name = new char[strlen(file_name) + 1];
  strcpy(name, file_name);
  main_display = nullptr;
  head = nullptr;
  next = list;
  list = this;
}